

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O2

optional<svg::Point> *
svg::getMinPoint(optional<svg::Point> *__return_storage_ptr__,
                vector<svg::Point,_std::allocator<svg::Point>_> *points)

{
  pointer pPVar1;
  pointer pPVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  
  pPVar1 = (points->super__Vector_base<svg::Point,_std::allocator<svg::Point>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (points->super__Vector_base<svg::Point,_std::allocator<svg::Point>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar1 != pPVar2) {
    uVar4 = *(undefined4 *)&pPVar1->x;
    uVar5 = *(undefined4 *)((long)&pPVar1->x + 4);
    uVar6 = *(undefined4 *)&pPVar1->y;
    uVar7 = *(undefined4 *)((long)&pPVar1->y + 4);
    for (uVar3 = 0; (ulong)uVar3 < (ulong)((long)pPVar2 - (long)pPVar1 >> 4); uVar3 = uVar3 + 1) {
      auVar8._4_4_ = uVar5;
      auVar8._0_4_ = uVar4;
      auVar8._8_4_ = uVar6;
      auVar8._12_4_ = uVar7;
      auVar8 = minpd((undefined1  [16])pPVar1[uVar3],auVar8);
      uVar4 = auVar8._0_4_;
      uVar5 = auVar8._4_4_;
      uVar6 = auVar8._8_4_;
      uVar7 = auVar8._12_4_;
    }
    __return_storage_ptr__->valid = true;
    *(undefined4 *)&(__return_storage_ptr__->type).x = uVar4;
    *(undefined4 *)((long)&(__return_storage_ptr__->type).x + 4) = uVar5;
    *(undefined4 *)&(__return_storage_ptr__->type).y = uVar6;
    *(undefined4 *)((long)&(__return_storage_ptr__->type).y + 4) = uVar7;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->valid = false;
  (__return_storage_ptr__->type).x = 0.0;
  (__return_storage_ptr__->type).y = 0.0;
  return __return_storage_ptr__;
}

Assistant:

inline optional<Point> getMinPoint(std::vector<Point> const & points)
    {
        if (points.empty())
            return optional<Point>();

        Point min = points[0];
        for (unsigned i = 0; i < points.size(); ++i) {
            if (points[i].x < min.x)
                min.x = points[i].x;
            if (points[i].y < min.y)
                min.y = points[i].y;
        }
        return optional<Point>(min);
    }